

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O2

void __thiscall TApp_MultipleSubcomMatching_Test::TestBody(TApp_MultipleSubcomMatching_Test *this)

{
  bool bVar1;
  App *this_00;
  AssertHelper local_120;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"first",(allocator *)&local_118);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_120);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_subcommand(this_00,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"second",(allocator *)&local_118);
  std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_120);
  CLI::App::add_subcommand(this_00,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_b0,"Second",(allocator *)&local_118);
  std::__cxx11::string::string((string *)&local_d0,"",(allocator *)&local_120);
  CLI::App::add_subcommand(this_00,&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_f0,"first",(allocator *)&local_118);
    std::__cxx11::string::string((string *)&local_110,"",(allocator *)&local_120);
    CLI::App::add_subcommand(this_00,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  testing::Message::Message((Message *)&local_118);
  testing::internal::AssertHelper::AssertHelper
            (&local_120,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
             ,0x45,
             "Expected: app.add_subcommand(\"first\") throws an exception of type CLI::OptionAlreadyAdded.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_118);
  testing::internal::AssertHelper::~AssertHelper(&local_120);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_118);
  return;
}

Assistant:

TEST_F(TApp, MultipleSubcomMatching) {
    app.add_subcommand("first");
    app.add_subcommand("second");
    app.add_subcommand("Second");
    EXPECT_THROW(app.add_subcommand("first"), CLI::OptionAlreadyAdded);
}